

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O2

void __thiscall
directed_flag_complex_computer::directed_flag_complex_computer_t::prepare_next_dimension
          (directed_flag_complex_computer_t *this,int dimension)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  vector<float,_std::allocator<float>_> *this_01;
  pointer pcVar1;
  pointer pfVar2;
  bool bVar3;
  bool bVar4;
  uint min_dimension;
  int iVar5;
  ostream *poVar6;
  long *plVar7;
  size_t sVar8;
  cell_hash_map_t *pcVar9;
  _Elt_pointer puVar10;
  pointer psVar11;
  index_t *piVar12;
  _Map_pointer ppuVar13;
  size_type sVar14;
  compressed_sparse_matrix<int> *this_02;
  size_t i_3;
  long lVar15;
  _Elt_pointer puVar16;
  pointer pfVar17;
  size_t i_1;
  pointer pcVar18;
  size_t i;
  ulong uVar19;
  unsigned_long uVar20;
  string fname;
  float f_2;
  value_t next_value;
  undefined4 uStack_2ac;
  pointer local_2a8;
  pointer local_2a0;
  _Map_pointer local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  vector<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
  store_coboundaries;
  index_t next_value_1;
  pointer paStack_250;
  pointer local_248;
  compressed_sparse_matrix<int> p;
  
  if (dimension == 0) {
    return;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"\x1b[K");
  poVar6 = std::operator<<(poVar6,"preparing dimension ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,dimension);
  poVar6 = std::operator<<(poVar6,": indexing ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,dimension);
  std::operator<<(poVar6,"-dimensional cells");
  poVar6 = (ostream *)std::ostream::flush();
  std::operator<<(poVar6,"\r");
  this->current_dimension = dimension;
  min_dimension = dimension + 1;
  this_00 = &this->cell_count;
  cell_hasher_t::dimension = (unsigned_short)min_dimension;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_00,(long)(dimension + 2));
  pcVar1 = (this->coboundary_matrix).
           super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pcVar18 = (this->coboundary_matrix).
                 super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pcVar18 != pcVar1; pcVar18 = pcVar18 + 1
      ) {
    compressed_sparse_matrix<int>::compressed_sparse_matrix(&p,pcVar18);
    compressed_sparse_matrix<int>::clear(&p);
    compressed_sparse_matrix<int>::~compressed_sparse_matrix(&p);
  }
  if ((int)(uint)this->max_dimension < dimension) {
    return;
  }
  if (this->_is_top_dimension != false) {
    return;
  }
  local_290 = &this->cache;
  bVar4 = std::operator!=(local_290,"");
  if (bVar4) {
    bVar4 = false;
    uVar19 = 0;
    do {
      if (this->nb_threads <= uVar19) break;
      compressed_sparse_matrix<int>::clear
                ((this->coboundary_matrix).
                 super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar19);
      std::__cxx11::string::string((string *)&fname,(string *)local_290);
      std::__cxx11::string::append((char *)&fname);
      std::__cxx11::to_string((string *)&p,this->current_dimension);
      std::__cxx11::string::append((string *)&fname);
      std::__cxx11::string::~string((string *)&p);
      std::__cxx11::string::append((char *)&fname);
      std::__cxx11::to_string((string *)&p,uVar19);
      std::__cxx11::string::append((string *)&fname);
      std::__cxx11::string::~string((string *)&p);
      std::ifstream::ifstream(&p,fname._M_dataplus._M_p,_S_bin);
      if ((uVar19 == 0) &&
         (*(int *)((long)&p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_last +
                  (long)p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Deque_impl_data._M_map[-3]) != 0)) {
        bVar3 = false;
      }
      else {
        std::istream::read((char *)&p,
                           (long)((this->cell_count).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start +
                                 (long)this->current_dimension + 1));
        std::istream::read((char *)&p,
                           (long)((this->coboundary_matrix_offsets).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start + uVar19));
        std::istream::read((char *)&p,(long)&next_value);
        while ((_next_value != (pointer)0x0 &&
               (plVar7 = (long *)std::istream::read((char *)&p,(long)&next_value_1),
               (*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0))) {
          this_02 = (this->coboundary_matrix).
                    super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar19;
          if (next_value_1 == -1) {
            compressed_sparse_matrix<int>::append_column(this_02);
          }
          else {
            compressed_sparse_matrix<int>::push_back(this_02,next_value_1);
          }
        }
        std::ifstream::close();
        bVar4 = true;
        bVar3 = true;
      }
      std::ifstream::~ifstream(&p);
      std::__cxx11::string::~string((string *)&fname);
      uVar19 = uVar19 + 1;
    } while (bVar3);
    std::__cxx11::string::string((string *)&fname,(string *)local_290);
    std::__cxx11::string::append((char *)&fname);
    std::__cxx11::to_string((string *)&p,this->current_dimension);
    std::__cxx11::string::append((string *)&fname);
    std::__cxx11::string::~string((string *)&p);
    std::ifstream::ifstream(&p,fname._M_dataplus._M_p,_S_bin);
    pfVar17 = (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish != pfVar17) {
      (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = pfVar17;
    }
    while (plVar7 = (long *)std::istream::read((char *)&p,(long)&next_value),
          (*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0) {
      std::vector<float,_std::allocator<float>_>::push_back(&this->next_filtration,&next_value);
    }
    std::ifstream::close();
    if (bVar4) {
      this->_is_top_dimension =
           (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[(long)this->current_dimension + 1] == 0;
      std::ifstream::~ifstream(&p);
      goto LAB_0012ffbf;
    }
    std::ifstream::~ifstream(&p);
    std::__cxx11::string::~string((string *)&fname);
  }
  if (this->filtration_algorithm != (filtration_algorithm_t *)0x0) {
    std::
    vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
    ::vector((vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
              *)&fname,this->nb_threads,(allocator_type *)&p);
    p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&next_value,this->nb_threads
               ,(value_type_conflict3 *)&p,(allocator_type *)&next_value_1);
    local_248 = (pointer)0x0;
    _next_value_1 = (pointer)0x0;
    paStack_250 = (pointer)0x0;
    lVar15 = 0;
    for (uVar19 = 0; uVar19 < this->nb_threads; uVar19 = uVar19 + 1) {
      p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)(fname._M_dataplus._M_p + lVar15);
      p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_map_size =
           CONCAT44(p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Deque_impl_data._M_map_size._4_4_,0xffffffff);
      std::
      vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
      ::emplace_back<directed_flag_complex_computer::add_cell_index_to_cache_t>
                ((vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                  *)&next_value_1,(add_cell_index_to_cache_t *)&p);
      add_cell_index_to_cache_t::~add_cell_index_to_cache_t((add_cell_index_to_cache_t *)&p);
      lVar15 = lVar15 + 0x40;
    }
    cell_hasher_t::dimension = (unsigned_short)dimension;
    iVar5 = (*this->filtration_algorithm->_vptr_filtration_algorithm_t[5])();
    if ((char)iVar5 != '\0') {
      directed_flag_complex_t::
      for_each_cell<directed_flag_complex_computer::add_cell_index_to_cache_t>
                (&this->flag_complex,
                 (vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                  *)&next_value_1,dimension,-1);
    }
    if (((int)(uint)this->min_dimension <= (int)min_dimension) ||
       (iVar5 = (*this->filtration_algorithm->_vptr_filtration_algorithm_t[5])(),
       (char)iVar5 != '\0')) {
      poVar6 = std::operator<<((ostream *)&std::cout,"\x1b[K");
      poVar6 = std::operator<<(poVar6,"preparing dimension ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,dimension);
      poVar6 = std::operator<<(poVar6,": computing the filtration of all ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,min_dimension);
      std::operator<<(poVar6,"-dimensional cells");
      poVar6 = (ostream *)std::ostream::flush();
      std::operator<<(poVar6,"\r");
      store_coboundaries.
      super__Vector_base<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      store_coboundaries.
      super__Vector_base<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      store_coboundaries.
      super__Vector_base<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      this_01 = &this->next_filtration;
      lVar15 = 0x20;
      pcVar9 = (cell_hash_map_t *)0x0;
      for (uVar19 = 0; uVar19 < this->nb_threads; uVar19 = uVar19 + 1) {
        (&_next_value->cache)[uVar19] = pcVar9;
        iVar5 = (*this->filtration_algorithm->_vptr_filtration_algorithm_t[5])();
        if ((char)iVar5 != '\0') {
          pcVar9 = (cell_hash_map_t *)
                   ((long)&(pcVar9->
                           super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                           )._M_h.field_0x0 + *(long *)(fname._M_dataplus._M_p + lVar15));
        }
        p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Deque_impl_data._M_map_size = (size_t)this->graph;
        p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Deque_impl_data._M_start._M_first = (_Elt_pointer)this->filtration_algorithm;
        p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Deque_impl_data._M_start._M_last =
             (_Elt_pointer)
             &((filtered_directed_graph_t *)
              p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_map_size)->edge_filtration;
        if (dimension != 1) {
          p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Deque_impl_data._M_start._M_last = (_Elt_pointer)this_01;
        }
        p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Deque_impl_data._M_finish._M_node = (_Map_pointer)this->nb_threads;
        p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Deque_impl_data._M_map =
             (_Map_pointer)
             CONCAT44(p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Deque_impl_data._M_map._4_4_,0xffffffff);
        p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
        p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
        p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
        p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
        p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)&fname;
        p.entries.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map
             = (_Map_pointer)_next_value;
        std::
        vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
        ::emplace_back<directed_flag_complex_computer::compute_filtration_t>
                  ((vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                    *)&store_coboundaries,(compute_filtration_t *)&p);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)
                   &p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node);
        lVar15 = lVar15 + 0x40;
      }
      directed_flag_complex_t::for_each_cell<directed_flag_complex_computer::compute_filtration_t>
                (&this->flag_complex,
                 (vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                  *)&store_coboundaries,min_dimension,-1);
      sVar8 = this->nb_threads;
      sVar14 = 0;
      psVar11 = store_coboundaries.
                super__Vector_base<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
                ._M_impl.super__Vector_impl_data._M_start;
      while (bVar4 = sVar8 != 0, sVar8 = sVar8 - 1, bVar4) {
        sVar14 = sVar14 + (long)psVar11->current_index + 1;
        psVar11 = (pointer)&psVar11[1].coboundary_matrix;
      }
      (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[(int)min_dimension] = sVar14;
      if (sVar14 == 0) {
        this->_is_top_dimension = true;
      }
      pfVar17 = (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish != pfVar17) {
        (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = pfVar17;
      }
      std::vector<float,_std::allocator<float>_>::reserve(this_01,sVar14);
      for (uVar19 = 0; uVar19 < this->nb_threads; uVar19 = uVar19 + 1) {
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&p,
                   (vector<float,_std::allocator<float>_> *)
                   ((long)store_coboundaries.
                          super__Vector_base<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar19 * 0x58 + 0x28));
        sVar8 = p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_map_size;
        for (ppuVar13 = p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Deque_impl_data._M_map; ppuVar13 != (_Map_pointer)sVar8;
            ppuVar13 = (_Map_pointer)((long)ppuVar13 + 4)) {
          f_2 = *(float *)ppuVar13;
          std::vector<float,_std::allocator<float>_>::push_back(this_01,&f_2);
        }
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&p);
      }
      std::
      vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
      ::~vector((vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                 *)&store_coboundaries);
    }
    std::
    vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
    ::~vector((vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
               *)&next_value_1);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&next_value);
    std::
    vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
    ::~vector((vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
               *)&fname);
  }
  if ((int)min_dimension < (int)(uint)this->min_dimension) {
    return;
  }
  cell_hasher_t::dimension = (unsigned_short)min_dimension;
  std::
  vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
  ::vector((vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
            *)&fname,this->nb_threads,(allocator_type *)&p);
  p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&next_value,this->nb_threads,
             (value_type_conflict3 *)&p,(allocator_type *)&next_value_1);
  local_248 = (pointer)0x0;
  _next_value_1 = (pointer)0x0;
  paStack_250 = (pointer)0x0;
  lVar15 = 0;
  for (uVar19 = 0; uVar19 < this->nb_threads; uVar19 = uVar19 + 1) {
    p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)(fname._M_dataplus._M_p + lVar15);
    p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Deque_impl_data._M_map_size =
         CONCAT44(p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_map_size._4_4_,0xffffffff);
    std::
    vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
    ::emplace_back<directed_flag_complex_computer::add_cell_index_to_cache_t>
              ((vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                *)&next_value_1,(add_cell_index_to_cache_t *)&p);
    add_cell_index_to_cache_t::~add_cell_index_to_cache_t((add_cell_index_to_cache_t *)&p);
    lVar15 = lVar15 + 0x40;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"\x1b[K");
  poVar6 = std::operator<<(poVar6,"preparing dimension ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,dimension);
  poVar6 = std::operator<<(poVar6,": indexing ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,min_dimension);
  std::operator<<(poVar6,"-dimensional cells");
  poVar6 = (ostream *)std::ostream::flush();
  std::operator<<(poVar6,"\r");
  if (this->_is_top_dimension == false) {
    directed_flag_complex_t::
    for_each_cell<directed_flag_complex_computer::add_cell_index_to_cache_t>
              (&this->flag_complex,
               (vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                *)&next_value_1,min_dimension,-1);
    piVar12 = &_next_value_1->current_index;
    pcVar9 = (cell_hash_map_t *)0x0;
    for (uVar19 = 0; uVar19 < this->nb_threads; uVar19 = uVar19 + 1) {
      (&_next_value->cache)[uVar19] = pcVar9;
      pcVar9 = (cell_hash_map_t *)
               (&(pcVar9->
                 super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                 )._M_h.field_0x1 + *piVar12);
      piVar12 = piVar12 + 4;
    }
    (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start[min_dimension] = (unsigned_long)pcVar9;
    if (pcVar9 == (cell_hash_map_t *)0x0) {
      this->_is_top_dimension = true;
    }
  }
  store_coboundaries.
  super__Vector_base<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  store_coboundaries.
  super__Vector_base<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  store_coboundaries.
  super__Vector_base<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar15 = 0;
  for (puVar16 = (_Elt_pointer)0x0; puVar10 = (_Elt_pointer)this->nb_threads, puVar16 < puVar10;
      puVar16 = (_Elt_pointer)((long)puVar16 + 1)) {
    memset(&p,0,0xa0);
    compressed_sparse_matrix<int>::compressed_sparse_matrix(&p);
    compressed_sparse_matrix<int>::operator=
              ((compressed_sparse_matrix<int> *)
               ((long)&(((this->coboundary_matrix).
                         super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->bounds).
                       super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Deque_impl_data._M_map + lVar15),&p);
    compressed_sparse_matrix<int>::~compressed_sparse_matrix(&p);
    lVar15 = lVar15 + 0xa0;
  }
  lVar15 = 0;
  for (puVar16 = (_Elt_pointer)0x0; puVar16 < puVar10; puVar16 = (_Elt_pointer)((long)puVar16 + 1))
  {
    p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Deque_impl_data._M_start._M_cur =
         (_Elt_pointer)
         ((long)&(((this->coboundary_matrix).
                   super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->bounds).
                 super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Deque_impl_data._M_map + lVar15);
    p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Deque_impl_data._M_start._M_first = (_Elt_pointer)this->graph;
    p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur =
         (_Elt_pointer)
         (long)(int)(this->cell_count).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[dimension];
    p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Deque_impl_data._M_map =
         (_Map_pointer)
         ((ulong)CONCAT31(p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Deque_impl_data._M_map._5_3_,puVar16 == (_Elt_pointer)0x0)
         << 0x20);
    p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Deque_impl_data._M_map_size =
         CONCAT44(p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_map_size._4_4_,dimension);
    p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Deque_impl_data._M_start._M_last = (_Elt_pointer)&fname;
    p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Deque_impl_data._M_start._M_node = (_Map_pointer)&next_value;
    p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Deque_impl_data._M_finish._M_last =
         (_Elt_pointer)
         CONCAT62(p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last._2_6_,this->modulus);
    p.bounds.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Deque_impl_data._M_finish._M_first = puVar10;
    std::
    vector<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
    ::emplace_back<directed_flag_complex_computer::store_coboundaries_in_cache_t>
              (&store_coboundaries,(store_coboundaries_in_cache_t *)&p);
    puVar10 = (_Elt_pointer)this->nb_threads;
    lVar15 = lVar15 + 0xa0;
  }
  directed_flag_complex_t::
  for_each_cell<directed_flag_complex_computer::store_coboundaries_in_cache_t>
            (&this->flag_complex,&store_coboundaries,dimension,-1);
  lVar15 = 0;
  uVar20 = 0;
  for (uVar19 = 0; uVar19 < this->nb_threads; uVar19 = uVar19 + 1) {
    (this->coboundary_matrix_offsets).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar19] = uVar20;
    sVar14 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                        ((long)&(((this->coboundary_matrix).
                                  super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->bounds).
                                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Deque_impl_data._M_map + lVar15));
    uVar20 = uVar20 + sVar14;
    lVar15 = lVar15 + 0xa0;
  }
  (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[dimension] = uVar20;
  poVar6 = std::operator<<((ostream *)&std::cout,"\x1b[K");
  poVar6 = std::operator<<(poVar6,"preparing dimension ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,dimension);
  std::operator<<(poVar6,": done computing coboundaries, now reducing memory consumption");
  poVar6 = (ostream *)std::ostream::flush();
  std::operator<<(poVar6,"\r");
  std::
  _Vector_base<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
  ::~_Vector_base(&store_coboundaries.
                   super__Vector_base<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
                 );
  std::
  vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
  ::~vector((vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
             *)&next_value_1);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&next_value);
  std::
  vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
  ::~vector((vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
             *)&fname);
  bVar4 = std::operator!=(local_290,"");
  if (!bVar4) {
    return;
  }
  for (uVar19 = 0; uVar19 < this->nb_threads; uVar19 = uVar19 + 1) {
    std::__cxx11::string::string((string *)&fname,(string *)local_290);
    std::__cxx11::string::append((char *)&fname);
    std::__cxx11::to_string((string *)&p,this->current_dimension);
    std::__cxx11::string::append((string *)&fname);
    std::__cxx11::string::~string((string *)&p);
    std::__cxx11::string::append((char *)&fname);
    std::__cxx11::to_string((string *)&p,uVar19);
    std::__cxx11::string::append((string *)&fname);
    std::__cxx11::string::~string((string *)&p);
    std::ofstream::ofstream(&p,fname._M_dataplus._M_p,_S_bin);
    f_2 = -NAN;
    std::ostream::write((char *)&p,
                        (long)((this->cell_count).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start +
                              (long)this->current_dimension + 1));
    std::ostream::write((char *)&p,
                        (long)((this->coboundary_matrix_offsets).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + uVar19));
    store_coboundaries.
    super__Vector_base<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)std::deque<unsigned_long,_std::allocator<unsigned_long>_>::size
                            (&(this->coboundary_matrix).
                              super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar19].bounds);
    std::ostream::write((char *)&p,(long)&store_coboundaries);
    for (psVar11 = (pointer)0x0;
        psVar11 < store_coboundaries.
                  super__Vector_base<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar11 = (pointer)((long)&psVar11->current_index + 1)) {
      std::ostream::write((char *)&p,(long)&f_2);
      compressed_sparse_matrix<int>::cbegin
                ((const_iterator *)&next_value,
                 (this->coboundary_matrix).
                 super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar19,(size_t)psVar11);
      while (compressed_sparse_matrix<int>::cend
                       ((const_iterator *)&next_value_1,
                        (this->coboundary_matrix).
                        super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar19,(size_t)psVar11),
            _next_value != _next_value_1) {
        std::ostream::write((char *)&p,(long)_next_value);
        _next_value = (pointer)((long)&_next_value->cache + 4);
        if (_next_value == local_2a0) {
          _next_value = (pointer)local_298[1];
          local_2a0 = _next_value + 0x20;
          local_2a8 = _next_value;
          local_298 = local_298 + 1;
        }
      }
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&p);
    std::__cxx11::string::~string((string *)&fname);
  }
  std::__cxx11::string::string((string *)&fname,(string *)local_290);
  std::__cxx11::string::append((char *)&fname);
  std::__cxx11::to_string((string *)&p,this->current_dimension);
  std::__cxx11::string::append((string *)&fname);
  std::__cxx11::string::~string((string *)&p);
  std::ofstream::ofstream(&p,fname._M_dataplus._M_p,_S_bin);
  pfVar2 = (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pfVar17 = (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start; pfVar17 != pfVar2; pfVar17 = pfVar17 + 1) {
    _next_value = (pointer)CONCAT44(uStack_2ac,*pfVar17);
    std::ostream::write((char *)&p,(long)&next_value);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&p);
LAB_0012ffbf:
  std::__cxx11::string::~string((string *)&fname);
  return;
}

Assistant:

void directed_flag_complex_computer_t::prepare_next_dimension(int dimension) {
	if (dimension == 0) return;

#ifdef INDICATE_PROGRESS
	std::cout << "\033[K"
	          << "preparing dimension " << dimension << ": indexing " << (dimension) << "-dimensional cells"
	          << std::flush << "\r";
#endif

	assert(dimension == current_dimension + 1);
	current_dimension = dimension;
	cell_hasher_t::set_current_cell_dimension(dimension + 1);
	cell_count.resize(dimension + 2);

	// Clean up
	for (auto p : coboundary_matrix) { p.clear(); }

	if (dimension > max_dimension || _is_top_dimension) return;

	if (cache != "") {
#ifdef USE_COEFFICIENTS
		// TODO: Make this work
		std::string err_msg = "Sorry, caching does not work with coefficients yet.";
		throw std::logic_error(err_msg);
#endif
		bool loaded_from_file = false;
		for (size_t i = 0; i < nb_threads; i++) {
			coboundary_matrix[i].clear();
			std::string fname = cache;
			fname += "/matrix_";
			fname += std::to_string(current_dimension);
			fname += "_";
			fname += std::to_string(i);
			std::ifstream f(fname.c_str(), std::ios::binary);
			if (i == 0 && !f.good()) break;
			loaded_from_file = true;

			f.read((char*)&(cell_count[current_dimension + 1]), sizeof(size_t));
			f.read((char*)&(coboundary_matrix_offsets[i]), sizeof(size_t));

			size_t this_size;
			f.read((char*)&(this_size), sizeof(size_t));

			index_t next_value;
			while (this_size > 0 && f.read((char*)&next_value, sizeof(index_t))) {
				if (next_value == -1)
					coboundary_matrix[i].append_column();
				else
					coboundary_matrix[i].push_back(next_value);
			}
			f.close();
		}

		std::string fname = cache;
		fname += "/filtration_";
		fname += std::to_string(current_dimension);
		std::ifstream f(fname.c_str(), std::ios::binary);
		next_filtration.clear();
		value_t next_value;
		while (f.read((char*)&next_value, sizeof(value_t))) next_filtration.push_back(next_value);
		f.close();

		if (loaded_from_file) {
			_is_top_dimension = cell_count[current_dimension + 1] == 0;
			return;
		}
	}

	{
		if (filtration_algorithm != nullptr) {
			// Add the current and next cells into the hash and compute the new
			// filtration
			std::vector<cell_hash_map_t> _cache_current_cells(nb_threads);
			std::vector<size_t> _cache_current_cells_offsets(nb_threads, 0);
			std::vector<add_cell_index_to_cache_t> init_current_cell_cache;
			for (size_t i = 0; i < nb_threads; i++) {
				init_current_cell_cache.push_back(add_cell_index_to_cache_t(_cache_current_cells[i]));
			}

			cell_hasher_t::set_current_cell_dimension(dimension);

			// Add the current cells into the cache if the filtration algorithm
			// needs them
			if (filtration_algorithm->needs_face_filtration())
				flag_complex.for_each_cell(init_current_cell_cache, dimension);

			// If we will actually compute coboundaries, then compute the
			// filtration. Also if we need the face filtrations.
			if (dimension + 1 >= min_dimension || filtration_algorithm->needs_face_filtration()) {
#ifdef INDICATE_PROGRESS
				std::cout << "\033[K"
				          << "preparing dimension " << dimension << ": computing the filtration of all "
				          << (dimension + 1) << "-dimensional cells" << std::flush << "\r";
#endif
				size_t offset = 0;
				std::vector<compute_filtration_t> compute_filtration;
				for (size_t i = 0; i < nb_threads; i++) {
					_cache_current_cells_offsets[i] = offset;
					if (filtration_algorithm->needs_face_filtration()) { offset += _cache_current_cells[i].size(); }
					compute_filtration.push_back(compute_filtration_t(
					    filtration_algorithm, graph, dimension == 1 ? graph.edge_filtration : next_filtration,
					    _cache_current_cells, nb_threads, _cache_current_cells_offsets.data()));
				}
				flag_complex.for_each_cell(compute_filtration, dimension + 1);

				size_t _cell_count = 0;
				for (size_t i = 0; i < nb_threads; i++) _cell_count += compute_filtration[i].number_of_cells();
				cell_count[dimension + 1] = _cell_count;
				if (_cell_count == 0) _is_top_dimension = true;

				// Combine the filtration
				next_filtration.clear();
				next_filtration.reserve(_cell_count);
				for (size_t i = 0; i < nb_threads; i++) {
					for (auto f : compute_filtration[i].filtration()) next_filtration.push_back(f);
				}
			}
		}

		// If we do not want the homology in the next degree, then we can stop
		// here
		if (dimension + 1 < min_dimension) return;

		cell_hasher_t::set_current_cell_dimension(dimension + 1);

		std::vector<cell_hash_map_t> _cache_next_cells(nb_threads);
		std::vector<size_t> _cache_next_cells_offsets(nb_threads, 0);
		std::vector<add_cell_index_to_cache_t> init_next_cell_cache;
		for (size_t i = 0; i < nb_threads; i++) {
			init_next_cell_cache.push_back(add_cell_index_to_cache_t(_cache_next_cells[i]));
		}
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "preparing dimension " << dimension << ": indexing " << (dimension + 1) << "-dimensional cells"
		          << std::flush << "\r";
#endif

		size_t _cell_count = 0;

		if (!is_top_dimension()) {
			flag_complex.for_each_cell(init_next_cell_cache, dimension + 1);

			for (size_t i = 0; i < nb_threads; i++) {
				_cache_next_cells_offsets[i] = _cell_count;
				_cell_count += init_next_cell_cache[i].number_of_cells();
			}
			cell_count[dimension + 1] = _cell_count;
			if (_cell_count == 0) _is_top_dimension = true;
		}

		// Now compute the coboundaries
		std::vector<store_coboundaries_in_cache_t> store_coboundaries;
		for (size_t i = 0; i < nb_threads; i++) coboundary_matrix[i] = compressed_sparse_matrix<entry_t>();
		for (size_t i = 0; i < nb_threads; i++) {
			store_coboundaries.push_back(store_coboundaries_in_cache_t(
			    coboundary_matrix[i], dimension, graph, _cache_next_cells, _cache_next_cells_offsets,
			    int(cell_count[dimension]), i == 0, nb_threads, modulus));
		}
		flag_complex.for_each_cell(store_coboundaries, dimension);

		_cell_count = 0;
		for (size_t i = 0; i < nb_threads; i++) {
			coboundary_matrix_offsets[i] = _cell_count;
			_cell_count += coboundary_matrix[i].size();
		}
		cell_count[dimension] = _cell_count;

#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "preparing dimension " << dimension
		          << ": done computing coboundaries, now reducing memory consumption" << std::flush << "\r";
#endif
	}

	if (cache != "") {
		for (size_t i = 0; i < nb_threads; i++) {
			std::string fname = cache;
			fname += "/matrix_";
			fname += std::to_string(current_dimension);
			fname += "_";
			fname += std::to_string(i);
			std::ofstream o(fname.c_str(), std::ios::binary);
			index_t separator = -1;
			o.write((char*)&(cell_count[current_dimension + 1]), sizeof(size_t));
			o.write((char*)&(coboundary_matrix_offsets[i]), sizeof(size_t));
			size_t this_size = coboundary_matrix[i].size();
			o.write((char*)&this_size, sizeof(size_t));
			for (auto j = 0ul; j < this_size; j++) {
				o.write((char*)&(separator), sizeof(index_t));
				for (auto it = coboundary_matrix[i].cbegin(j); it != coboundary_matrix[i].cend(j); ++it) {
					o.write((char*)&(*it), sizeof(index_t));
				}
			}
			o.close();
		}

		std::string fname = cache;
		fname += "/filtration_";
		fname += std::to_string(current_dimension);
		std::ofstream o(fname.c_str(), std::ios::binary);
		for (auto f : next_filtration) o.write((char*)&f, sizeof(value_t));
		o.close();
	}
}